

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalGenerator::AddCompilerRequirementFlag
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *lang)

{
  pointer pcVar1;
  cmake *this_00;
  cmLocalGenerator *pcVar2;
  cmMakefile *pcVar3;
  _func_int ***ppp_Var4;
  size_type sVar5;
  cmLocalGenerator *pcVar6;
  bool bVar7;
  bool bVar8;
  long *plVar9;
  char *pcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar12;
  mapped_type *pmVar13;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __rhs;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var14;
  cmMakefile *pcVar15;
  size_t sVar16;
  string *psVar17;
  ostream *poVar18;
  undefined8 *puVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  pointer pbVar21;
  size_type *psVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  long lVar24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined8 uVar25;
  _Alloc_hider _Var26;
  string *i;
  pointer pbVar27;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optVec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string type;
  string extProp;
  string standard;
  string stdProp;
  char *defaultStd;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  string local_2b8;
  undefined1 local_298 [32];
  cmGeneratorTarget *local_278;
  cmLocalGenerator *local_270;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e0;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8 [6];
  ios_base local_168 [264];
  string local_60;
  char *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  if (lang->_M_string_length == 0) {
    return;
  }
  pcVar15 = this->Makefile;
  local_278 = target;
  local_270 = this;
  std::operator+(&local_200,"CMAKE_",lang);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_200);
  local_1d8._0_8_ = local_1c8;
  paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 == paVar20) {
    local_1c8[0]._0_8_ = paVar20->_M_allocated_capacity;
    local_1c8[0]._8_8_ = plVar9[3];
  }
  else {
    local_1c8[0]._0_8_ = paVar20->_M_allocated_capacity;
    local_1d8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar9;
  }
  local_1d8._8_8_ = plVar9[1];
  *plVar9 = (long)paVar20;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  pcVar10 = cmMakefile::GetDefinition(pcVar15,(string *)local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._0_8_ != local_1c8) {
    operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,(ulong)(local_200.field_2._M_allocated_capacity + 1))
    ;
  }
  if (pcVar10 == (char *)0x0) {
    return;
  }
  if (*pcVar10 == '\0') {
    return;
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  pcVar1 = (lang->_M_dataplus)._M_p;
  local_40 = pcVar10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,pcVar1,pcVar1 + lang->_M_string_length);
  std::__cxx11::string::append((char *)&local_200);
  pcVar10 = cmGeneratorTarget::GetProperty(local_278,&local_200);
  if (pcVar10 == (char *)0x0) {
    bVar7 = true;
  }
  else {
    bVar7 = cmSystemTools::IsOff(pcVar10);
    bVar7 = !bVar7;
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  pcVar1 = (lang->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + lang->_M_string_length);
  std::__cxx11::string::append((char *)&local_60);
  pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            cmGeneratorTarget::GetProperty(local_278,&local_60);
  if (pbVar11 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (bVar7 == false) goto LAB_0030c13a;
    std::operator+(&local_240,"CMAKE_",lang);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_240);
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar20) {
      local_1c8[0]._0_8_ = paVar20->_M_allocated_capacity;
      local_1c8[0]._8_8_ = plVar9[3];
      local_1d8._0_8_ = local_1c8;
    }
    else {
      local_1c8[0]._0_8_ = paVar20->_M_allocated_capacity;
      local_1d8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar9;
    }
    local_1d8._8_8_ = plVar9[1];
    *plVar9 = (long)paVar20;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    paVar20 = &local_240.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar20) {
      operator_delete(local_240._M_dataplus._M_p,
                      (ulong)(local_240.field_2._M_allocated_capacity + 1));
    }
    pcVar15 = cmTarget::GetMakefile(local_278->Target);
    pcVar10 = cmMakefile::GetDefinition(pcVar15,(string *)local_1d8);
    if (pcVar10 != (char *)0x0) {
      local_2b8._M_dataplus._M_p = (pointer)0x0;
      local_2b8._M_string_length = 0;
      local_2b8.field_2._M_allocated_capacity = 0;
      local_240._M_dataplus._M_p = (pointer)paVar20;
      sVar16 = strlen(pcVar10);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,pcVar10,pcVar10 + sVar16)
      ;
      cmSystemTools::ExpandListArgument
                (&local_240,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_2c8 + 0x10),false);
      _Var26._M_p = local_2b8._M_dataplus._M_p;
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._M_string_length;
      pcVar2 = local_270;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != paVar20) {
        operator_delete(local_240._M_dataplus._M_p,
                        (ulong)(local_240.field_2._M_allocated_capacity + 1));
        _Var26._M_p = local_2b8._M_dataplus._M_p;
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_string_length;
        pcVar2 = local_270;
      }
      for (; pcVar6 = local_270, sVar5 = local_2b8._M_string_length,
          _Var26._M_p != (pointer)local_2b8._M_string_length;
          _Var26._M_p = (pointer)((long)_Var26._M_p + 0x20)) {
        ppp_Var4 = &local_270->_vptr_cmLocalGenerator;
        local_2b8._M_string_length = (size_type)paVar23;
        local_270 = pcVar2;
        (*(*ppp_Var4)[8])(pcVar6,flags,_Var26._M_p);
        paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2b8._M_string_length;
        pcVar2 = local_270;
        local_270 = pcVar6;
        local_2b8._M_string_length = sVar5;
      }
      local_2b8._M_string_length = (size_type)paVar23;
      local_270 = pcVar2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_2c8 + 0x10));
    }
    local_240.field_2._M_allocated_capacity = local_1c8[0]._M_allocated_capacity;
    _Var26._M_p = (pointer)local_1d8._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ == local_1c8) goto LAB_0030c13a;
  }
  else {
    pcVar10 = "STANDARD";
    if (bVar7 != false) {
      pcVar10 = "EXTENSION";
    }
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_240,pcVar10,pcVar10 + (ulong)bVar7 + 8);
    local_1d8._0_8_ = local_1c8;
    pcVar1 = (lang->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1d8,pcVar1,pcVar1 + lang->_M_string_length);
    std::__cxx11::string::append(local_1d8);
    bVar8 = cmGeneratorTarget::GetPropertyAsBool(local_278,(string *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != local_1c8) {
      operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
    }
    if (bVar8) {
      std::operator+(&local_260,"CMAKE_",lang);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_260);
      pbVar21 = (pointer)(plVar9 + 2);
      if ((pointer)*plVar9 == pbVar21) {
        local_298._16_8_ = (pbVar21->_M_dataplus)._M_p;
        local_298._24_8_ = plVar9[3];
        local_298._0_8_ = (pointer)(local_298 + 0x10);
      }
      else {
        local_298._16_8_ = (pbVar21->_M_dataplus)._M_p;
        local_298._0_8_ = (pointer)*plVar9;
      }
      local_298._8_8_ = plVar9[1];
      *plVar9 = (long)pbVar21;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append(local_298);
      local_2d8._0_8_ = local_2c8;
      pbVar21 = (pointer)(plVar9 + 2);
      if ((pointer)*plVar9 == pbVar21) {
        local_2c8._0_8_ = (pbVar21->_M_dataplus)._M_p;
        local_2c8._8_8_ = plVar9[3];
      }
      else {
        local_2c8._0_8_ = (pbVar21->_M_dataplus)._M_p;
        local_2d8._0_8_ = (pointer)*plVar9;
      }
      local_2d8._8_8_ = plVar9[1];
      *plVar9 = (long)pbVar21;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append(local_2d8,(ulong)local_240._M_dataplus._M_p);
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 == paVar20) {
        local_1c8[0]._0_8_ = paVar20->_M_allocated_capacity;
        local_1c8[0]._8_8_ = plVar9[3];
        local_1d8._0_8_ = local_1c8;
      }
      else {
        local_1c8[0]._0_8_ = paVar20->_M_allocated_capacity;
        local_1d8._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar9;
      }
      local_1d8._8_8_ = plVar9[1];
      *plVar9 = (long)paVar20;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_1e0 = pbVar11;
      plVar9 = (long *)std::__cxx11::string::append(local_1d8);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 == paVar20) {
        local_2b8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_2b8.field_2._8_8_ = plVar9[3];
      }
      else {
        local_2b8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_2b8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_2b8._M_string_length = plVar9[1];
      *plVar9 = (long)paVar20;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != local_1c8) {
        operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
      }
      if ((pointer)local_2d8._0_8_ != (pointer)local_2c8) {
        operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._0_8_ + 1));
      }
      if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      pcVar15 = cmTarget::GetMakefile(local_278->Target);
      pcVar10 = cmMakefile::GetDefinition(pcVar15,(string *)(local_2c8 + 0x10));
      if (pcVar10 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d8,"Target \"",8);
        pbVar11 = local_1e0;
        pcVar2 = local_270;
        psVar17 = cmGeneratorTarget::GetName_abi_cxx11_(local_278);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1d8,(psVar17->_M_dataplus)._M_p,
                             psVar17->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,"\" requires the language dialect \"",0x21);
        poVar18 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar18,(lang->_M_dataplus)._M_p,lang->_M_string_length);
        sVar16 = strlen((char *)pbVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,(char *)pbVar11,sVar16);
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,"\" ",2);
        pcVar10 = "";
        if (bVar7 != false) {
          pcVar10 = "(with compiler extensions)";
        }
        lVar24 = 0x1a;
        if (bVar7 == false) {
          lVar24 = 0;
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar18,pcVar10,lVar24);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar18,", but CMake does not know the compile flags to use to enable it.",0x40);
        std::__cxx11::stringbuf::str();
        cmake::IssueMessage(pcVar2->GlobalGenerator->CMakeInstance,FATAL_ERROR,(string *)local_2d8,
                            &pcVar2->DirectoryBacktrace);
        if ((pointer)local_2d8._0_8_ != (pointer)local_2c8) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._0_8_ + 1));
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
        std::ios_base::~ios_base(local_168);
      }
      else {
        local_2d8._0_8_ = (pointer)0x0;
        local_2d8._8_8_ = (cmMakefile *)0x0;
        local_2c8._0_8_ = (pointer)0x0;
        local_1d8._0_8_ = local_1c8;
        sVar16 = strlen(pcVar10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1d8,pcVar10,pcVar10 + sVar16);
        cmSystemTools::ExpandListArgument
                  ((string *)local_1d8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2d8,false);
        pcVar15 = (cmMakefile *)local_2d8._0_8_;
        pcVar3 = (cmMakefile *)local_2d8._8_8_;
        pcVar2 = local_270;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != local_1c8) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
          pcVar15 = (cmMakefile *)local_2d8._0_8_;
          pcVar3 = (cmMakefile *)local_2d8._8_8_;
          pcVar2 = local_270;
        }
        for (; pcVar6 = local_270, uVar25 = local_2d8._8_8_,
            pcVar15 != (cmMakefile *)local_2d8._8_8_;
            pcVar15 = (cmMakefile *)
                      &(pcVar15->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last) {
          ppp_Var4 = &local_270->_vptr_cmLocalGenerator;
          local_2d8._8_8_ = pcVar3;
          local_270 = pcVar2;
          (*(*ppp_Var4)[8])(pcVar6,flags,pcVar15);
          pcVar3 = (cmMakefile *)local_2d8._8_8_;
          pcVar2 = local_270;
          local_270 = pcVar6;
          local_2d8._8_8_ = uVar25;
        }
        local_2d8._8_8_ = pcVar3;
        local_270 = pcVar2;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d8);
      }
      uVar25 = local_2b8.field_2._M_allocated_capacity;
      _Var26._M_p = local_2b8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
LAB_0030c10d:
        operator_delete(_Var26._M_p,(ulong)((long)&((_Base_ptr)uVar25)->_M_color + 1));
      }
    }
    else {
      if (AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
          ::langStdMap_abi_cxx11_ == '\0') {
        AddCompilerRequirementFlag();
      }
      if (AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
          ::langStdMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        local_1d8._0_8_ = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CXX","");
        pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                ::langStdMap_abi_cxx11_,(key_type *)local_1d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar12,(char (*) [3])0x4de12f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != local_1c8) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        local_1d8._0_8_ = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CXX","");
        pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                ::langStdMap_abi_cxx11_,(key_type *)local_1d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar12,(char (*) [3])0x4de117);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != local_1c8) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        local_1d8._0_8_ = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CXX","");
        pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                ::langStdMap_abi_cxx11_,(key_type *)local_1d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar12,(char (*) [3])0x4de0ff);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != local_1c8) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        local_1d8._0_8_ = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CXX","");
        pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                ::langStdMap_abi_cxx11_,(key_type *)local_1d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar12,(char (*) [3])0x4de425);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != local_1c8) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        local_1d8._0_8_ = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CXX","");
        pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                ::langStdMap_abi_cxx11_,(key_type *)local_1d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar12,(char (*) [3])0x4db9c4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != local_1c8) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        local_1d8._0_8_ = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"C","");
        pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                ::langStdMap_abi_cxx11_,(key_type *)local_1d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar12,(char (*) [3])0x4de425);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != local_1c8) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        local_1d8._0_8_ = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"C","");
        pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                ::langStdMap_abi_cxx11_,(key_type *)local_1d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar12,(char (*) [3])0x53ddd7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != local_1c8) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        local_1d8._0_8_ = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"C","");
        pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                ::langStdMap_abi_cxx11_,(key_type *)local_1d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar12,(char (*) [3])0x4de30f);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != local_1c8) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        local_1d8._0_8_ = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CUDA","");
        pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                ::langStdMap_abi_cxx11_,(key_type *)local_1d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar12,(char (*) [3])0x4de0ff);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != local_1c8) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        local_1d8._0_8_ = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CUDA","");
        pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                ::langStdMap_abi_cxx11_,(key_type *)local_1d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar12,(char (*) [3])0x4de425);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != local_1c8) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
        local_1d8._0_8_ = local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"CUDA","");
        pvVar12 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                                ::langStdMap_abi_cxx11_,(key_type *)local_1d8);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[3]>(pvVar12,(char (*) [3])0x4db9c4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._0_8_ != local_1c8) {
          operator_delete((void *)local_1d8._0_8_,(ulong)(local_1c8[0]._M_allocated_capacity + 1));
        }
      }
      local_1d8._0_8_ = local_1c8;
      sVar16 = strlen((char *)pbVar11);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,pbVar11,(char *)((long)&(pbVar11->_M_dataplus)._M_p + sVar16));
      pmVar13 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&AddCompilerRequirementFlag(std::__cxx11::string&,cmGeneratorTarget_const*,std::__cxx11::string_const&)
                              ::langStdMap_abi_cxx11_,lang);
      __rhs = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        ((pmVar13->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,
                         (pmVar13->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish,local_1d8);
      pbVar21 = (pmVar13->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      if (__rhs._M_current == pbVar21) {
        pcVar1 = (lang->_M_dataplus)._M_p;
        local_298._0_8_ = (pointer)(local_298 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_298,pcVar1,pcVar1 + lang->_M_string_length);
        std::__cxx11::string::append(local_298);
        pcVar2 = local_270;
        plVar9 = (long *)std::__cxx11::string::_M_append(local_298,local_1d8._0_8_);
        pbVar21 = (pointer)(plVar9 + 2);
        if ((pointer)*plVar9 == pbVar21) {
          local_2c8._0_8_ = (pbVar21->_M_dataplus)._M_p;
          local_2c8._8_8_ = plVar9[3];
          local_2d8._0_8_ = (pointer)local_2c8;
        }
        else {
          local_2c8._0_8_ = (pbVar21->_M_dataplus)._M_p;
          local_2d8._0_8_ = (pointer)*plVar9;
        }
        local_2d8._8_8_ = plVar9[1];
        *plVar9 = (long)pbVar21;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        puVar19 = (undefined8 *)std::__cxx11::string::append(local_2d8);
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 == paVar20) {
          local_2b8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_2b8.field_2._8_8_ = puVar19[3];
        }
        else {
          local_2b8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_2b8._M_dataplus._M_p = (pointer)*puVar19;
        }
        local_2b8._M_string_length = puVar19[1];
        *puVar19 = paVar20;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        if ((pointer)local_2d8._0_8_ != (pointer)local_2c8) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._0_8_ + 1));
        }
        if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
        }
        this_00 = pcVar2->GlobalGenerator->CMakeInstance;
        cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_2d8);
        cmake::IssueMessage(this_00,FATAL_ERROR,(string *)(local_2c8 + 0x10),
                            (cmListFileBacktrace *)local_2d8);
        if ((cmMakefile *)local_2d8._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
        }
LAB_0030c0d9:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
LAB_0030c0e3:
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        _Var14 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                           ((pmVar13->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,pbVar21,&local_40);
        if (_Var14._M_current ==
            (pmVar13->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish) {
          std::operator+(&local_260,"CMAKE_",lang);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_260);
          pcVar2 = local_270;
          pbVar21 = (pointer)(plVar9 + 2);
          if ((pointer)*plVar9 == pbVar21) {
            local_298._16_8_ = (pbVar21->_M_dataplus)._M_p;
            local_298._24_8_ = plVar9[3];
            local_298._0_8_ = (pointer)(local_298 + 0x10);
          }
          else {
            local_298._16_8_ = (pbVar21->_M_dataplus)._M_p;
            local_298._0_8_ = (pointer)*plVar9;
          }
          local_298._8_8_ = plVar9[1];
          *plVar9 = (long)pbVar21;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_220,local_40,&local_261);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_298,&local_220);
          puVar19 = (undefined8 *)std::__cxx11::string::append(local_2d8);
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
          paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar19 == paVar20) {
            local_2b8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_2b8.field_2._8_8_ = puVar19[3];
          }
          else {
            local_2b8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
            local_2b8._M_dataplus._M_p = (pointer)*puVar19;
          }
          local_2b8._M_string_length = puVar19[1];
          *puVar19 = paVar20;
          puVar19[1] = 0;
          *(undefined1 *)(puVar19 + 2) = 0;
          if ((pointer)local_2d8._0_8_ != (pointer)local_2c8) {
            operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._0_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
            operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          cmake::IssueMessage(pcVar2->GlobalGenerator->CMakeInstance,INTERNAL_ERROR,
                              (string *)(local_2c8 + 0x10),&pcVar2->DirectoryBacktrace);
          goto LAB_0030c0d9;
        }
        if (__rhs._M_current < _Var14._M_current) {
          paVar20 = &local_2b8.field_2;
          local_1e0 = lang;
          local_38 = _Var14._M_current;
LAB_0030b585:
          std::operator+(&local_220,"CMAKE_",local_1e0);
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_220,
                                      (ulong)((__rhs._M_current)->_M_dataplus)._M_p);
          psVar22 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar22) {
            local_260.field_2._M_allocated_capacity = *psVar22;
            local_260.field_2._8_8_ = plVar9[3];
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          }
          else {
            local_260.field_2._M_allocated_capacity = *psVar22;
            local_260._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_260._M_string_length = plVar9[1];
          *plVar9 = (long)psVar22;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_260);
          local_298._0_8_ = local_298 + 0x10;
          pbVar21 = (pointer)(plVar9 + 2);
          if ((pointer)*plVar9 == pbVar21) {
            local_298._16_8_ = (pbVar21->_M_dataplus)._M_p;
            local_298._24_8_ = plVar9[3];
          }
          else {
            local_298._16_8_ = (pbVar21->_M_dataplus)._M_p;
            local_298._0_8_ = (pointer)*plVar9;
          }
          local_298._8_8_ = plVar9[1];
          *plVar9 = (long)pbVar21;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::_M_append
                                     (local_298,(ulong)local_240._M_dataplus._M_p);
          pbVar21 = (pointer)(plVar9 + 2);
          if ((pointer)*plVar9 == pbVar21) {
            local_2c8._0_8_ = (pbVar21->_M_dataplus)._M_p;
            local_2c8._8_8_ = plVar9[3];
            local_2d8._0_8_ = (pointer)local_2c8;
          }
          else {
            local_2c8._0_8_ = (pbVar21->_M_dataplus)._M_p;
            local_2d8._0_8_ = (pointer)*plVar9;
          }
          local_2d8._8_8_ = plVar9[1];
          *plVar9 = (long)pbVar21;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          plVar9 = (long *)std::__cxx11::string::append(local_2d8);
          paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar23) {
            local_2b8.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_2b8.field_2._8_8_ = plVar9[3];
            local_2b8._M_dataplus._M_p = (pointer)paVar20;
          }
          else {
            local_2b8.field_2._M_allocated_capacity = paVar23->_M_allocated_capacity;
            local_2b8._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_2b8._M_string_length = plVar9[1];
          *plVar9 = (long)paVar23;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((pointer)local_2d8._0_8_ != (pointer)local_2c8) {
            operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._0_8_ + 1));
          }
          if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
            operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_220._M_dataplus._M_p != &local_220.field_2) {
            operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
          }
          pcVar15 = cmTarget::GetMakefile(local_278->Target);
          pcVar10 = cmMakefile::GetDefinition(pcVar15,(string *)(local_2c8 + 0x10));
          if (pcVar10 == (char *)0x0) goto code_r0x0030b78c;
          local_298._0_8_ = (pointer)0x0;
          local_298._8_8_ = (pointer)0x0;
          local_298._16_8_ = (_Base_ptr)0x0;
          local_2d8._0_8_ = local_2c8;
          sVar16 = strlen(pcVar10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_2d8,pcVar10,pcVar10 + sVar16);
          cmSystemTools::ExpandListArgument
                    ((string *)local_2d8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_298,false);
          pcVar2 = local_270;
          pbVar27 = (pointer)local_298._0_8_;
          pbVar21 = (pointer)local_298._8_8_;
          if ((pointer)local_2d8._0_8_ != (pointer)local_2c8) {
            operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._0_8_ + 1));
            pbVar27 = (pointer)local_298._0_8_;
            pbVar21 = (pointer)local_298._8_8_;
          }
          for (; pbVar27 != pbVar21; pbVar27 = pbVar27 + 1) {
            (*pcVar2->_vptr_cmLocalGenerator[8])(pcVar2,flags,pbVar27);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != paVar20) goto LAB_0030c0e3;
          goto LAB_0030c0f0;
        }
        std::operator+(&local_220,"CMAKE_",lang);
        std::operator+(&local_260,&local_220,__rhs._M_current);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_260);
        pbVar21 = (pointer)(plVar9 + 2);
        if ((pointer)*plVar9 == pbVar21) {
          local_298._16_8_ = (pbVar21->_M_dataplus)._M_p;
          local_298._24_8_ = plVar9[3];
          local_298._0_8_ = (pointer)(local_298 + 0x10);
        }
        else {
          local_298._16_8_ = (pbVar21->_M_dataplus)._M_p;
          local_298._0_8_ = (pointer)*plVar9;
        }
        local_298._8_8_ = plVar9[1];
        *plVar9 = (long)pbVar21;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_2d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_298,&local_240);
        puVar19 = (undefined8 *)std::__cxx11::string::append(local_2d8);
        paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar19 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar19 == paVar20) {
          local_2b8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_2b8.field_2._8_8_ = puVar19[3];
          local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        }
        else {
          local_2b8.field_2._M_allocated_capacity = paVar20->_M_allocated_capacity;
          local_2b8._M_dataplus._M_p = (pointer)*puVar19;
        }
        local_2b8._M_string_length = puVar19[1];
        *puVar19 = paVar20;
        puVar19[1] = 0;
        *(undefined1 *)(puVar19 + 2) = 0;
        if ((pointer)local_2d8._0_8_ != (pointer)local_2c8) {
          operator_delete((void *)local_2d8._0_8_,(ulong)(local_2c8._0_8_ + 1));
        }
        if ((pointer)local_298._0_8_ != (pointer)(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_,(ulong)(local_298._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        pcVar15 = cmTarget::GetMakefile(local_278->Target);
        psVar17 = cmMakefile::GetRequiredDefinition(pcVar15,(string *)(local_2c8 + 0x10));
        local_2d8._0_8_ = (pointer)0x0;
        local_2d8._8_8_ = (cmMakefile *)0x0;
        local_2c8._0_8_ = (pointer)0x0;
        cmSystemTools::ExpandListArgument
                  (psVar17,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_2d8,false);
        uVar25 = local_2d8._8_8_;
        for (pcVar15 = (cmMakefile *)local_2d8._0_8_; pcVar15 != (cmMakefile *)uVar25;
            pcVar15 = (cmMakefile *)
                      &(pcVar15->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last) {
          (*local_270->_vptr_cmLocalGenerator[8])(local_270,flags,pcVar15);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) goto LAB_0030c0e3;
      }
LAB_0030c0f0:
      uVar25 = local_1c8[0]._M_allocated_capacity;
      _Var26._M_p = (pointer)local_1d8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._0_8_ != local_1c8) goto LAB_0030c10d;
    }
    _Var26._M_p = local_240._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p == &local_240.field_2) goto LAB_0030c13a;
  }
  operator_delete(_Var26._M_p,
                  (ulong)((long)&((_Base_ptr)local_240.field_2._M_allocated_capacity)->_M_color + 1)
                 );
LAB_0030c13a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,(ulong)(local_60.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,(ulong)(local_200.field_2._M_allocated_capacity + 1))
    ;
  }
  return;
code_r0x0030b78c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != paVar20) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  __rhs._M_current = __rhs._M_current + 1;
  if (local_38 <= __rhs._M_current) goto LAB_0030c0f0;
  goto LAB_0030b585;
}

Assistant:

void cmLocalGenerator::AddCompilerRequirementFlag(
  std::string& flags, cmGeneratorTarget const* target, const std::string& lang)
{
  if (lang.empty()) {
    return;
  }
  const char* defaultStd =
    this->Makefile->GetDefinition("CMAKE_" + lang + "_STANDARD_DEFAULT");
  if (!defaultStd || !*defaultStd) {
    // This compiler has no notion of language standard levels.
    return;
  }
  std::string extProp = lang + "_EXTENSIONS";
  bool ext = true;
  if (const char* extPropValue = target->GetProperty(extProp)) {
    if (cmSystemTools::IsOff(extPropValue)) {
      ext = false;
    }
  }
  std::string stdProp = lang + "_STANDARD";
  const char* standardProp = target->GetProperty(stdProp);
  if (!standardProp) {
    if (ext) {
      // No language standard is specified and extensions are not disabled.
      // Check if this compiler needs a flag to enable extensions.
      std::string const option_flag =
        "CMAKE_" + lang + "_EXTENSION_COMPILE_OPTION";
      if (const char* opt =
            target->Target->GetMakefile()->GetDefinition(option_flag)) {
        std::vector<std::string> optVec;
        cmSystemTools::ExpandListArgument(opt, optVec);
        for (std::string const& i : optVec) {
          this->AppendFlagEscape(flags, i);
        }
      }
    }
    return;
  }

  std::string const type = ext ? "EXTENSION" : "STANDARD";

  if (target->GetPropertyAsBool(lang + "_STANDARD_REQUIRED")) {
    std::string option_flag =
      "CMAKE_" + lang + standardProp + "_" + type + "_COMPILE_OPTION";

    const char* opt =
      target->Target->GetMakefile()->GetDefinition(option_flag);
    if (!opt) {
      std::ostringstream e;
      e << "Target \"" << target->GetName()
        << "\" requires the language "
           "dialect \""
        << lang << standardProp << "\" "
        << (ext ? "(with compiler extensions)" : "")
        << ", but CMake "
           "does not know the compile flags to use to enable it.";
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    } else {
      std::vector<std::string> optVec;
      cmSystemTools::ExpandListArgument(opt, optVec);
      for (std::string const& i : optVec) {
        this->AppendFlagEscape(flags, i);
      }
    }
    return;
  }

  static std::map<std::string, std::vector<std::string>> langStdMap;
  if (langStdMap.empty()) {
    // Maintain sorted order, most recent first.
    langStdMap["CXX"].emplace_back("20");
    langStdMap["CXX"].emplace_back("17");
    langStdMap["CXX"].emplace_back("14");
    langStdMap["CXX"].emplace_back("11");
    langStdMap["CXX"].emplace_back("98");

    langStdMap["C"].emplace_back("11");
    langStdMap["C"].emplace_back("99");
    langStdMap["C"].emplace_back("90");

    langStdMap["CUDA"].emplace_back("14");
    langStdMap["CUDA"].emplace_back("11");
    langStdMap["CUDA"].emplace_back("98");
  }

  std::string standard(standardProp);

  std::vector<std::string>& stds = langStdMap[lang];

  std::vector<std::string>::const_iterator stdIt =
    std::find(stds.begin(), stds.end(), standard);
  if (stdIt == stds.end()) {
    std::string e =
      lang + "_STANDARD is set to invalid value '" + standard + "'";
    this->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, e, target->GetBacktrace());
    return;
  }

  std::vector<std::string>::const_iterator defaultStdIt =
    std::find(stds.begin(), stds.end(), defaultStd);
  if (defaultStdIt == stds.end()) {
    std::string e = "CMAKE_" + lang +
      "_STANDARD_DEFAULT is set to invalid value '" + std::string(defaultStd) +
      "'";
    this->IssueMessage(MessageType::INTERNAL_ERROR, e);
    return;
  }

  // If the standard requested is older than the compiler's default
  // then we need to use a flag to change it.  The comparison is
  // greater-or-equal because the standards are stored in backward
  // chronological order.
  if (stdIt >= defaultStdIt) {
    std::string option_flag =
      "CMAKE_" + lang + *stdIt + "_" + type + "_COMPILE_OPTION";

    std::string const& opt =
      target->Target->GetMakefile()->GetRequiredDefinition(option_flag);
    std::vector<std::string> optVec;
    cmSystemTools::ExpandListArgument(opt, optVec);
    for (std::string const& i : optVec) {
      this->AppendFlagEscape(flags, i);
    }
    return;
  }

  // The standard requested is at least as new as the compiler's default,
  // and the standard request is not required.  Decay to the newest standard
  // for which a flag is defined.
  for (; stdIt < defaultStdIt; ++stdIt) {
    std::string option_flag =
      "CMAKE_" + lang + *stdIt + "_" + type + "_COMPILE_OPTION";

    if (const char* opt =
          target->Target->GetMakefile()->GetDefinition(option_flag)) {
      std::vector<std::string> optVec;
      cmSystemTools::ExpandListArgument(opt, optVec);
      for (std::string const& i : optVec) {
        this->AppendFlagEscape(flags, i);
      }
      return;
    }
  }
}